

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalTestNamer::getRelativeTestSourceDirectory_abi_cxx11_(ApprovalTestNamer *this)

{
  string *in_RDI;
  string *originalDir;
  TestName *in_stack_ffffffffffffff08;
  string *replaceWith;
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff58;
  string local_88 [32];
  string local_68 [48];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  getCurrentTest();
  replaceWith = local_38;
  TestName::getOriginalFileName_abi_cxx11_(in_stack_ffffffffffffff08);
  FileUtils::getDirectory(in_stack_ffffffffffffff58);
  ::std::__cxx11::string::~string((string *)local_38);
  ::std::__cxx11::string::string(local_88,(string *)in_RDI);
  TestName::getRootDirectory_abi_cxx11_();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff38,"",(allocator *)&stack0xffffffffffffff37);
  StringUtils::replaceAll(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,replaceWith);
  ::std::__cxx11::string::operator=((string *)in_RDI,local_68);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  ::std::__cxx11::string::~string(local_88);
  return in_RDI;
}

Assistant:

std::string ApprovalTestNamer::getRelativeTestSourceDirectory() const
    {
        // We are using the original directory - as obtained from __FILE__,
        // as this seems to be consistent for relative paths, regardless of
        // Ninja __FILE__ quirks
        auto originalDir =
            FileUtils::getDirectory(getCurrentTest().getOriginalFileName());
        originalDir =
            StringUtils::replaceAll(originalDir, TestName::getRootDirectory(), "");
        return originalDir;
    }